

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O1

void __thiscall DDoor::DoorSound(DDoor *this,bool raise,DSeqNode *curseq)

{
  char cVar1;
  uint uVar2;
  sector_t *psVar3;
  uint mode1;
  bool bVar4;
  long lVar5;
  FTexture *pFVar6;
  char *pcVar7;
  char *name;
  FName local_34;
  
  psVar3 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  if ((psVar3->Flags & 0x40) == 0) {
    mode1 = raise ^ 3;
    if (this->m_Speed < 8.0) {
      mode1 = (uint)!raise;
    }
    if (psVar3->seqType < 0) {
      lVar5 = (long)(psVar3->SeqName).super_FName.Index;
      if (lVar5 == 0) {
        if (gameinfo.gametype == GAME_Heretic) {
          name = "HereticDoor";
        }
        else if (gameinfo.gametype == GAME_Strife) {
          if ((long)psVar3->linecount < 1) {
            name = "DoorSmallMetal";
          }
          else {
            name = "DoorSmallMetal";
            lVar5 = 0;
            do {
              if (psVar3->lines[lVar5]->backsector != (sector_t *)0x0) {
                uVar2 = psVar3->lines[lVar5]->sidedef[0]->textures[0].texture.texnum;
                if (uVar2 < TexMan.Textures.Count) {
                  pFVar6 = TexMan.Textures.Array[(int)uVar2].Texture;
                }
                else {
                  pFVar6 = (FTexture *)0x0;
                }
                if (pFVar6 == (FTexture *)0x0) {
                  pcVar7 = (char *)0x0;
                }
                else {
                  pcVar7 = (pFVar6->Name).Chars;
                }
                if ((((pcVar7 != (char *)0x0) && (*pcVar7 == 'D')) && (pcVar7[1] == 'O')) &&
                   (pcVar7[2] == 'R')) {
                  cVar1 = pcVar7[3];
                  if (cVar1 == 'M') {
                    if (pcVar7[4] == 'L') {
                      name = "DoorLargeMetal";
                    }
                  }
                  else if (cVar1 == 'W') {
                    name = "DoorSmallWood";
                    if (pcVar7[4] == 'L') {
                      name = "DoorLargeWood";
                    }
                  }
                  else if (cVar1 == 'S') {
                    name = "DoorStone";
                  }
                }
              }
              lVar5 = lVar5 + 1;
            } while (psVar3->linecount != lVar5);
          }
        }
        else {
          name = "DoorNormal";
        }
        if ((curseq == (DSeqNode *)0x0) ||
           (bVar4 = SN_AreModesSame(name,mode1,curseq->m_ModeNum), !bVar4)) {
          SN_StartSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                           name,mode1);
          return;
        }
      }
      else if ((curseq == (DSeqNode *)0x0) ||
              (bVar4 = SN_AreModesSame(FName::NameData.NameArray[lVar5].Text,mode1,curseq->m_ModeNum
                                      ), !bVar4)) {
        SN_StartSequence((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         &local_34,mode1);
      }
    }
    else if ((curseq == (DSeqNode *)0x0) ||
            (bVar4 = SN_AreModesSame((int)psVar3->seqType,SEQ_DOOR,mode1,curseq->m_ModeNum), !bVar4)
            ) {
      psVar3 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
      SN_StartSequence(psVar3,2,(int)psVar3->seqType,SEQ_DOOR,mode1,false);
      return;
    }
  }
  return;
}

Assistant:

void DDoor::DoorSound(bool raise, DSeqNode *curseq) const
{
	int choice;

	// For multiple-selection sound sequences, the following choices are used:
	//  0  Opening
	//  1  Closing
	//  2  Opening fast
	//  3  Closing fast

	choice = !raise;

	if (m_Sector->Flags & SECF_SILENTMOVE) return;

	if (m_Speed >= 8)
	{
		choice += 2;
	}

	if (m_Sector->seqType >= 0)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->seqType, SEQ_DOOR, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->seqType, SEQ_DOOR, choice);
		}
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		if (curseq == NULL || !SN_AreModesSame(m_Sector->SeqName, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, m_Sector->SeqName, choice);
		}
	}
	else
	{
		const char *snd;

		switch (gameinfo.gametype)
		{
		default:	/* Doom and Hexen */
			snd = "DoorNormal";
			break;
			
		case GAME_Heretic:
			snd = "HereticDoor";
			break;

		case GAME_Strife:
			snd = "DoorSmallMetal";

			// Search the front top textures of 2-sided lines on the door sector
			// for a door sound to use.
			for (int i = 0; i < m_Sector->linecount; ++i)
			{
				const char *texname;
				line_t *line = m_Sector->lines[i];

				if (line->backsector == NULL)
					continue;

				FTexture *tex = TexMan[line->sidedef[0]->GetTexture(side_t::top)];
				texname = tex ? tex->Name.GetChars() : NULL;
				if (texname != NULL && texname[0] == 'D' && texname[1] == 'O' && texname[2] == 'R')
				{
					switch (texname[3])
					{
					case 'S':
						snd = "DoorStone";
						break;

					case 'M':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeMetal";
						}
						break;

					case 'W':
						if (texname[4] == 'L')
						{
							snd = "DoorLargeWood";
						}
						else
						{
							snd = "DoorSmallWood";
						}
						break;
					}
				}
			}
			break;
		}
		if (curseq == NULL || !SN_AreModesSame(snd, choice, curseq->GetModeNum()))
		{
			SN_StartSequence(m_Sector, CHAN_CEILING, snd, choice);
		}
	}
}